

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

int __thiscall position::see_move(position *this,Move *m)

{
  byte bVar1;
  Piece PVar2;
  long lVar3;
  SeePiece *pSVar4;
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  U64 UVar10;
  ulong uVar11;
  Piece PVar12;
  SeePiece *pSVar13;
  uint uVar14;
  uint uVar15;
  Color CVar16;
  ulong uVar17;
  Square to;
  Square bks;
  U64 pieces;
  vector<SeePiece,_std::allocator<SeePiece>_> white_list;
  vector<SeePiece,_std::allocator<SeePiece>_> black_list;
  Square wks;
  SeePiece local_b8;
  pointer local_b0;
  Square local_a8;
  Square local_a4;
  ulong local_a0;
  vector<SeePiece,_std::allocator<SeePiece>_> local_98;
  vector<SeePiece,_std::allocator<SeePiece>_> local_78;
  ulong local_58;
  Color local_50;
  Color local_4c;
  Color local_48;
  Square local_44;
  SeePiece *local_40;
  SeePiece *local_38;
  
  local_a4 = (this->ifo).ks[1];
  local_44 = (this->ifo).ks[0];
  local_a8 = (Square)m->t;
  bVar1 = m->f;
  uVar17 = (this->pcs).bycolor._M_elems[0];
  local_58 = (this->pcs).bycolor._M_elems[1];
  local_a0 = local_58 | uVar17;
  local_b0 = (pointer)(uVar17 ^ (this->ifo).pinned[0]);
  local_58 = local_58 ^ (this->ifo).pinned[1];
  local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  PVar12 = no_piece;
  do {
    UVar10 = attackers_of(this,&local_a8,&local_a0);
    uVar17 = UVar10 & local_a0;
    if (uVar17 == 0) {
      iVar9 = 3;
    }
    else {
      local_a0 = local_a0 ^ uVar17;
      local_b8.p = pawn;
      local_48 = black;
      bVar7 = is_attacked(this,&local_44,&local_b8.p,&local_48,local_a0);
      if (bVar7) {
        iVar9 = 1;
      }
      else {
        local_4c = black;
        local_50 = white;
        bVar7 = is_attacked(this,&local_a4,&local_4c,&local_50,local_a0);
        iVar9 = 1;
        if (!bVar7) {
          for (uVar11 = uVar17 & (ulong)local_b0; uVar11 != 0; uVar11 = uVar11 & uVar11 - 1) {
            lVar3 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            if ((uint)lVar3 == (uint)bVar1) {
              PVar12 = (this->pcs).piece_on._M_elems[lVar3];
            }
            else {
              local_b8.p = (this->pcs).piece_on._M_elems[lVar3];
              local_b8.score =
                   (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_b8.p];
              std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                        (&local_98,&local_b8);
            }
          }
          for (uVar17 = uVar17 & local_58; uVar17 != 0; uVar17 = uVar17 & uVar17 - 1) {
            lVar3 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            if ((uint)lVar3 == (uint)bVar1) {
              PVar12 = (this->pcs).piece_on._M_elems[lVar3];
            }
            else {
              local_b8.p = (this->pcs).piece_on._M_elems[lVar3];
              local_b8.score =
                   (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_b8.p];
              std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                        (&local_78,&local_b8);
            }
          }
          if (((local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start) ||
              (local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start)) || (PVar12 != no_piece)) {
            iVar9 = 0;
          }
        }
      }
    }
    pSVar6 = local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar5 = local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_start;
  } while (iVar9 == 0);
  if (iVar9 != 3) {
    if (local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_start != (SeePiece *)0x0) {
      operator_delete(local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_start != (SeePiece *)0x0) {
      operator_delete(local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return 0;
  }
  if (local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar17 = (long)local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar6);
  }
  pSVar6 = local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar5 = local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar17 = (long)local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar6);
  }
  CVar16 = (this->ifo).stm;
  local_b8.p = PVar12;
  if (CVar16 == black) {
    local_b8.score = 0;
    std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
              (&local_78,
               (const_iterator)
               local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,&local_b8);
  }
  else {
    local_b8.score = 0;
    std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
              (&local_98,
               (const_iterator)
               local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,&local_b8);
  }
  local_40 = local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar11 = (long)local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_38 = local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar17 = (long)local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_b0 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_58 = 8;
  bVar7 = false;
  while (!bVar7) {
    if ((this->pcs).piece_on._M_elems[local_a8] == king) {
      uVar8 = 1;
      goto LAB_00121a53;
    }
    CVar16 = CVar16 ^ black;
    bVar7 = true;
  }
  uVar8 = 9;
  if ((uVar11 == 0) || (uVar17 == 0)) goto LAB_00121a53;
  uVar15 = (uint)(CVar16 != white);
  uVar14 = (uint)(CVar16 == white);
  pSVar4 = local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((CVar16 == white) &&
     (pSVar4 = local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start, uVar15 < uVar11)) {
    pSVar13 = local_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
              super__Vector_impl_data._M_start + uVar15;
LAB_0012192f:
    PVar12 = pSVar13->p;
    iVar9 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[PVar12];
  }
  else {
    PVar12 = no_piece;
    iVar9 = -1;
    if ((CVar16 == black) && (uVar14 < uVar17)) {
      pSVar13 = local_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      goto LAB_0012192f;
    }
  }
  uVar8 = 9;
  if (PVar12 == no_piece) goto LAB_00121a53;
  PVar2 = pSVar4->p;
  if (PVar2 == king ||
      mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [PVar2] < iVar9) {
    if (PVar12 == king) {
      if (CVar16 == black) {
        if (uVar11 <= uVar15) goto LAB_001219c7;
      }
      else if ((CVar16 != white) || (uVar17 <= uVar14)) goto LAB_001219c7;
    }
    else {
LAB_001219c7:
      if (PVar2 == king) {
        if (CVar16 != black) {
          if (CVar16 != white) goto code_r0x00121a37;
          uVar17 = (ulong)uVar15;
          goto joined_r0x001219e3;
        }
        uVar11 = (ulong)uVar14;
      }
      else {
        if (CVar16 == black) {
joined_r0x001219e3:
          if (uVar11 <= uVar17) goto code_r0x00121a37;
          goto LAB_00121a4a;
        }
        if (CVar16 != white) goto code_r0x00121a37;
      }
      if (uVar17 <= uVar11) goto code_r0x00121a37;
    }
LAB_00121a4a:
    uVar8 = 1;
  }
  else {
code_r0x00121a37:
    uVar8 = 0;
  }
LAB_00121a53:
  iVar9 = (*(code *)((long)&DAT_001328d0 + (long)(int)(&DAT_001328d0)[uVar8]))();
  return iVar9;
}

Assistant:

int position::see_move(const Move& m) const {

	Square bks = king_square(black);
	Square wks = king_square(white);
	Square to = Square(m.t);
	Square from = Square(m.f);
	U64 pieces = all_pieces();
	U64 attackers = 0ULL;

	U64 white_bb = get_pieces<white>() ^ pinned<white>();
	U64 black_bb = get_pieces<black>() ^ pinned<black>();

	std::vector<SeePiece> black_list;
	std::vector<SeePiece> white_list;
	Piece atkr = Piece::no_piece;

	while (true) { // while loop for pieces behind currently attacking pieces
		U64 a = attackers_of(to, pieces) & pieces;
		if (a) {
			pieces ^= a;

			if (is_attacked(wks, white, black, pieces) || is_attacked(bks, black, white, pieces))
			{
				return 0; // let search handle discovered checking sequences
			}

			attackers |= a;
		}
		else break;

		U64 white_attackers = a & white_bb;
		if (white_attackers) {
			while (white_attackers) {
				Square s = Square(bits::pop_lsb(white_attackers));
				if (s == from) {
					atkr = piece_on(Square(s));
					continue; // first attacker is handled below
				}
				white_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		U64 black_attackers = a & black_bb;
		if (black_attackers) {
			while (black_attackers) {
				Square s = Square(bits::pop_lsb(black_attackers));
				if (s == from) {
					atkr = piece_on(s);
					continue;
				}
				black_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		if (white_list.size() == 0 && black_list.size() == 0 && atkr == Piece::no_piece) return 0;
	}

	std::sort(white_list.begin(), white_list.end());
	std::sort(black_list.begin(), black_list.end());


	int i = 0;
	unsigned w = 0;
	unsigned b = 0;
	Color color = to_move();


	if (color == black) { black_list.insert(black_list.begin(), SeePiece(atkr, 0)); }
	else { white_list.insert(white_list.begin(), SeePiece(atkr, 0)); }

	int score = 0;
	int prev = score;

	while (true) {

		Piece victim = Piece::no_piece;
		if (i == 0) {
			Piece v = piece_on(to);
			if (v == Piece::king) return 0; // illegal
			score += (v == Piece::no_piece ? 0 : mvals[v]);
			color = Color(color ^ 1);
			prev = score;
			++i;
			continue;
		}

		if ((w >= white_list.size() || b >= black_list.size())) break;

		victim = (color == white ? black_list[b++].p : white_list[w++].p);

		int av = -1;
		Piece attacker = Piece::no_piece;
		if (color == white && w < white_list.size()) {
			attacker = white_list[w].p;
			av = mvals[attacker];
		}
		else if (color == black && b < black_list.size()) {
			attacker = black_list[b].p;
			av = mvals[attacker];
		}

		if (attacker == Piece::no_piece) break;


		color = Color(color ^ 1);
		int vv = mvals[victim];



		if (vv < av || victim == king) {
			if (attacker == king) {
				if ((color == black && b < black_list.size()) ||
					(color == white && w < white_list.size())) {
					return score; // illegal
				}
			}


			if ((victim == king && ((color == black && w < white_list.size()) || (color == white && b < black_list.size()))) ||
				(victim != king && ((color == black && (black_list.size() > white_list.size())) ||
					(color == white && (white_list.size() > black_list.size()))))) {
				score = prev;
				return score;
			}
		}
		score += ((i & 1) == 1 ? -vv : vv);
		++i;
		prev = score;
	}

	return score;
}